

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_2::anon_unknown_0::readDeepScanLine<Imf_3_2::DeepScanLineInputFile>
               (DeepScanLineInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  Header *pHVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  void *pvVar8;
  long *plVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  size_type __new_size;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  size_t __n;
  long lVar21;
  long *plVar22;
  bool bVar23;
  Array<Imf_3_2::Array<void_*>_> data;
  vector<float,_std::allocator<float>_> pixelBuffer;
  DeepFrameBuffer frameBuffer;
  
  Imf_3_2::DeepScanLineInputFile::header();
  piVar3 = (int *)Imf_3_2::Header::dataWindow();
  iVar1 = piVar3[2];
  lVar4 = (long)*piVar3;
  pHVar5 = (Header *)Imf_3_2::DeepScanLineInputFile::header();
  Imf_3_2::calculateBytesPerPixel(pHVar5);
  Imf_3_2::Header::channels();
  p_Var6 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  uVar19 = (iVar1 - lVar4) + 1;
  __n = 0;
  uVar15 = 0;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var7 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var6 == p_Var7) break;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    uVar15 = uVar15 - 1;
    __n = __n + 0x10;
  }
  pvVar8 = operator_new__(-(ulong)(uVar19 >> 0x3e != 0) | uVar19 * 4);
  plVar9 = (long *)operator_new__(__n + 8);
  lVar10 = -uVar15;
  *plVar9 = lVar10;
  data._data = (Array<void_*> *)(plVar9 + 1);
  iVar14 = (int)uVar15;
  data._size = lVar10;
  if (iVar14 != 0) {
    memset(data._data,0,__n);
    lVar21 = -uVar15;
    do {
      plVar22 = plVar9 + 2;
      pvVar11 = operator_new__(-(ulong)(uVar19 >> 0x3d != 0) | uVar19 * 8);
      if ((void *)*plVar22 != (void *)0x0) {
        operator_delete__((void *)*plVar22);
      }
      plVar9[1] = uVar19;
      *plVar22 = (long)pvVar11;
      lVar21 = lVar21 + -1;
      plVar9 = plVar22;
    } while (lVar21 != 0);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice
            ((Slice *)&pixelBuffer,UINT,(char *)((long)pvVar8 + lVar4 * -4),4,0,1,1,0.0,false,false)
  ;
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_2::Header::channels();
  p_Var6 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  lVar21 = 8;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var7 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var6 == p_Var7) break;
    Imf_3_2::DeepSlice::DeepSlice
              ((DeepSlice *)&pixelBuffer,FLOAT,
               (char *)(*(long *)((long)&(data._data)->_size + lVar21) + lVar4 * -8),8,0,4,1,1,0.0,
               false,false);
    Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var6 + 1));
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    lVar21 = lVar21 + 0x10;
  }
  Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)in);
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar3[1] <= piVar3[3]) {
    iVar20 = piVar3[1];
    do {
      Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)in);
      if (uVar19 == 0) {
        __new_size = 0;
      }
      else {
        uVar12 = 0;
        __new_size = 0;
        do {
          if (iVar14 != 0) {
            __new_size = __new_size +
                         (ulong)*(uint *)((long)pvVar8 + uVar12 * 4) * ((~uVar15 & 0xffffffff) + 1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar19 != uVar12);
      }
      std::vector<float,_std::allocator<float>_>::resize(&pixelBuffer,__new_size);
      if (uVar19 != 0) {
        lVar13 = 0;
        lVar21 = 0;
        do {
          if (iVar14 != 0) {
            uVar2 = *(uint *)((long)pvVar8 + lVar21 * 4);
            lVar16 = lVar13 * 4;
            lVar13 = lVar13 + lVar10 * (ulong)uVar2;
            lVar17 = 2;
            lVar18 = -uVar15;
            do {
              if (uVar2 == 0) {
                *(undefined8 *)(*(long *)((long)&(data._data)->_size + lVar17 * 4) + lVar21 * 8) = 0
                ;
              }
              else {
                *(long *)(*(long *)((long)&(data._data)->_size + lVar17 * 4) + lVar21 * 8) =
                     (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar16;
              }
              lVar17 = lVar17 + 4;
              lVar16 = lVar16 + (ulong)uVar2 * 4;
              lVar18 = lVar18 + -1;
            } while (lVar18 != 0);
          }
          bVar23 = lVar21 != iVar1 - lVar4;
          lVar21 = lVar21 + 1;
        } while (bVar23);
      }
      Imf_3_2::DeepScanLineInputFile::readPixels((int)in);
      bVar23 = iVar20 < piVar3[3];
      iVar20 = iVar20 + 1;
    } while (bVar23);
    if (pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Array<Imf_3_2::Array<void_*>_>::~Array(&data);
  operator_delete__(pvVar8);
  return false;
}

Assistant:

bool
readDeepScanLine (T& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;
    try
    {
        const Header& fileHeader = in.header ();
        const Box2i&  dw         = fileHeader.dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int dwx = dw.min.x;

        uint64_t bytesPerSample = calculateBytesPerPixel (in.header ());

        //
        // in reduce memory mode, check size required by sampleCount table
        //
        if (reduceMemory && w * 4 > gMaxBytesPerScanline) { return false; }

        int channelCount = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channelCount)
            ;

        Array<unsigned int> localSampleCount;
        localSampleCount.resizeErase (w);
        Array<Array<void*>> data (channelCount);

        for (int i = 0; i < channelCount; i++)
        {
            data[i].resizeErase (w);
        }

        DeepFrameBuffer frameBuffer;

        frameBuffer.insertSampleCountSlice (Slice (
            UINT, (char*) (&localSampleCount[-dwx]), sizeof (unsigned int), 0));

        int channel = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channel)
        {
            PixelType type = FLOAT;

            int sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                i.name (),
                DeepSlice (
                    type,
                    (char*) (&data[channel][-dwx]),
                    pointerSize,
                    0,
                    sampleSize));
        }

        in.setFrameBuffer (frameBuffer);

        int step = 1;

        vector<float> pixelBuffer;

        for (int y = dw.min.y; y <= dw.max.y; y += step)
        {
            in.readPixelSampleCounts (y);

            //
            // count how many samples are required to store this scanline
            // in reduceMemory mode, pixels with large sample counts are not read,
            // but the library needs to allocate memory for them internally
            // - bufferSize is how much memory this function will allocate
            // - fileBufferSize tracks how much decompressed data the library will require
            //
            size_t bufferSize = 0;
            size_t fileBufferSize = 0;
            for (uint64_t j = 0; j < w; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    fileBufferSize += localSampleCount[j];
                    //
                    // don't read samples which require a lot of memory in reduceMemory mode
                    //

                    if (!reduceMemory || localSampleCount[j] * bytesPerSample <=
                                             gMaxBytesPerDeepPixel)
                    {
                        bufferSize += localSampleCount[j];
                    }
                }
            }

            //
            // limit total number of samples read in reduceMemory mode
            //
            if (!reduceMemory || fileBufferSize + bufferSize < gMaxBytesPerDeepScanline)
            {
                //
                // allocate sample buffer and set per-pixel pointers into buffer
                //
                pixelBuffer.resize (bufferSize);

                size_t bufferIndex = 0;
                for (uint64_t j = 0; j < w; j++)
                {
                    for (int k = 0; k < channelCount; k++)
                    {

                        if (localSampleCount[j] == 0 ||
                            (reduceMemory &&
                             localSampleCount[j] * bytesPerSample >
                                 gMaxBytesPerDeepPixel))
                        {
                            data[k][j] = nullptr;
                        }
                        else
                        {
                            data[k][j] = &pixelBuffer[bufferIndex];
                            bufferIndex += localSampleCount[j];
                        }
                    }
                }

                try
                {
                    in.readPixels (y);
                }
                catch (...)
                {
                    threw = true;
                    //
                    // in reduceTime mode, fail immediately - the file is corrupt
                    //
                    if (reduceTime) { return threw; }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }
    return threw;
}